

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__gcd
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  StackMemoryManager *this_00;
  ParserChar *text;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  gcd__AttributeData *pgVar4;
  StringHash SVar5;
  char **ppcVar6;
  xmlChar **ppxVar7;
  bool failed;
  ParserChar *attributeValue;
  URI *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  URI *local_120;
  URI local_118;
  
  pgVar4 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::gcd__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar7 = attributes->attributes;
  if (ppxVar7 != (xmlChar **)0x0) {
    local_120 = &pgVar4->href;
    local_128 = &pgVar4->_class;
    local_130 = &pgVar4->definitionURL;
    this_00 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
    for (; text = *ppxVar7, text != (ParserChar *)0x0; ppxVar7 = ppxVar7 + 2) {
      SVar5 = GeneratedSaxParser::Utils::calculateStringHash(text);
      attributeValue = ppxVar7[1];
      if (SVar5 == 0x6f4) {
        pgVar4->id = attributeValue;
      }
      else if (SVar5 == 0x6f8b6) {
        GeneratedSaxParser::Utils::toURI(&local_118,&attributeValue,&failed);
        COLLADABU::URI::operator=(local_120,&local_118);
        COLLADABU::URI::~URI(&local_118);
        if ((failed == true) &&
           (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x6d94,0x6f8b6,attributeValue), bVar2)
           ) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&pgVar4->present_attributes = (byte)pgVar4->present_attributes | 4;
        }
      }
      else if (SVar5 == 0x7f8b6) {
        pgVar4->xref = attributeValue;
      }
      else if (SVar5 == 0x593f0c) {
        GeneratedSaxParser::Utils::toURI(&local_118,&attributeValue,&failed);
        COLLADABU::URI::operator=(local_130,&local_118);
        COLLADABU::URI::~URI(&local_118);
        if ((failed == true) &&
           (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x6d94,0x593f0c,attributeValue), bVar2
           )) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&pgVar4->present_attributes = (byte)pgVar4->present_attributes | 1;
        }
      }
      else if (SVar5 == 0x6a28a3) {
        bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,attributeValue,local_128);
        if (bVar2) {
          *(byte *)&pgVar4->present_attributes = (byte)pgVar4->present_attributes | 2;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x6d94,0x6a28a3,attributeValue);
          if (bVar2) {
            return false;
          }
        }
      }
      else if (SVar5 == 0x7ac025) {
        pgVar4->style = attributeValue;
      }
      else if (SVar5 == 0x4a5aa87) {
        pgVar4->encoding = attributeValue;
      }
      else {
        if ((pgVar4->unknownAttributes).data == (char **)0x0) {
          ppcVar6 = (char **)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
        }
        else {
          ppcVar6 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
        }
        (pgVar4->unknownAttributes).data = ppcVar6;
        sVar1 = (pgVar4->unknownAttributes).size;
        ppcVar6[sVar1] = text;
        (pgVar4->unknownAttributes).data[sVar1 + 1] = attributeValue;
        (pgVar4->unknownAttributes).size = sVar1 + 2;
      }
    }
  }
  uVar3 = pgVar4->present_attributes;
  if ((uVar3 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pgVar4->definitionURL,&local_118);
    COLLADABU::URI::~URI(&local_118);
    uVar3 = pgVar4->present_attributes;
  }
  if ((uVar3 & 2) == 0) {
    (pgVar4->_class).data = (ParserString *)0x0;
    (pgVar4->_class).size = 0;
  }
  if ((uVar3 & 4) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pgVar4->href,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__gcd( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__gcd( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

gcd__AttributeData* attributeData = newData<gcd__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_GCD,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_GCD, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_GCD,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_GCD,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_GCD,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= gcd__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}
if ((attributeData->present_attributes & gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & gcd__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}